

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz.h
# Opt level: O3

ZZ<136UL> * __thiscall GF2::ZZ<136UL>::operator-=(ZZ<136UL> *this,ZZ<136UL> *zRight)

{
  size_t pos;
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  lVar1 = 0;
  uVar2 = 0;
  do {
    uVar4 = (this->super_WW<136UL>)._words[lVar1] - uVar2;
    (this->super_WW<136UL>)._words[lVar1] = uVar4;
    uVar3 = uVar4 - (zRight->super_WW<136UL>)._words[lVar1];
    (this->super_WW<136UL>)._words[lVar1] = uVar3;
    if (!CARRY8(uVar4,uVar2)) {
      uVar2 = (ulong)CARRY8(uVar3,(zRight->super_WW<136UL>)._words[lVar1]);
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  (this->super_WW<136UL>)._words[2] = (ulong)(byte)(this->super_WW<136UL>)._words[2];
  return this;
}

Assistant:

ZZ& operator-=(const ZZ& zRight)
	{	
		word borrow = 0;
		for (size_t pos = 0; pos < _wcount; pos++)
			if ((_words[pos] -= borrow) > WORD_MAX - borrow) 
				_words[pos] -= zRight.GetWord(pos);
            else 
				borrow = (_words[pos] -= zRight.GetWord(pos)) > 
					WORD_MAX - zRight.GetWord(pos);
		Trim();
		return *this;
	}